

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printVectorListTwoSpacedAllLanes(MCInst *MI,uint OpNum,SStream *O,MCRegisterInfo *MRI)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint8_t uVar3;
  uint uVar4;
  uint id;
  uint index;
  MCOperand *op;
  cs_struct *in_RCX;
  MCRegisterInfo *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg1;
  uint Reg0;
  uint Reg;
  uint8_t access;
  cs_struct *s;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar5;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar4 = MCOperand_getReg(op);
  id = MCRegisterInfo_getSubReg(in_RDX,(uint)((ulong)in_RCX >> 0x20),(uint)in_RCX);
  index = MCRegisterInfo_getSubReg(in_RDX,(uint)((ulong)in_RCX >> 0x20),(uint)in_RCX);
  s = in_RDI->csh;
  MCInst_getOpcode(in_RDI);
  uVar3 = get_op_access((cs_struct *)CONCAT44(in_stack_ffffffffffffffdc,uVar4),id,index);
  uVar5 = CONCAT13(uVar3,(int3)in_stack_ffffffffffffffdc);
  SStream_concat0((SStream *)CONCAT44(id,index),(char *)s);
  printRegName(in_RCX,(SStream *)CONCAT44(uVar5,uVar4),id);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = id;
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] =
         (uint8_t)((uint)uVar5 >> 0x18);
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  SStream_concat0((SStream *)CONCAT44(id,index),(char *)s);
  printRegName(in_RCX,(SStream *)CONCAT44(uVar5,uVar4),id);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = index;
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] =
         (uint8_t)((uint)uVar5 >> 0x18);
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  SStream_concat0((SStream *)CONCAT44(id,index),(char *)s);
  in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
  return;
}

Assistant:

static void printVectorListTwoSpacedAllLanes(MCInst *MI,
		unsigned OpNum, SStream *O, MCRegisterInfo *MRI)
{
#ifndef CAPSTONE_DIET
	uint8_t access;
#endif
	unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	unsigned Reg0 = MCRegisterInfo_getSubReg(MRI, Reg, ARM_dsub_0);
	unsigned Reg1 = MCRegisterInfo_getSubReg(MRI, Reg, ARM_dsub_2);

#ifndef CAPSTONE_DIET
	access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
#endif

	SStream_concat0(O, "{");
	printRegName(MI->csh, O, Reg0);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg0;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[], ");
	printRegName(MI->csh, O, Reg1);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = Reg1;
#ifndef CAPSTONE_DIET
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
#endif
		MI->flat_insn->detail->arm.op_count++;
	}
	SStream_concat0(O, "[]}");

#ifndef CAPSTONE_DIET
	MI->ac_idx++;
#endif
}